

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O1

void __thiscall higan::LogFile::~LogFile(LogFile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  std::unique_ptr<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_>::~unique_ptr
            (&this->file_ptr_);
  pcVar2 = (this->log_prefix_)._M_dataplus._M_p;
  paVar1 = &(this->log_prefix_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->log_dir_)._M_dataplus._M_p;
  paVar1 = &(this->log_dir_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::unique_ptr<higan::Mutex,_std::default_delete<higan::Mutex>_>::~unique_ptr(&this->mutex_);
  return;
}

Assistant:

LogFile::~LogFile()
{

}